

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backward_references_hq.c
# Opt level: O3

size_t UpdateNodes(size_t num_bytes,size_t block_start,size_t pos,uint8_t *ringbuffer,
                  size_t ringbuffer_mask,BrotliEncoderParams *params,size_t max_backward_limit,
                  int *starting_dist_cache,size_t num_matches,BackwardMatch *matches,
                  ZopfliCostModel *model,StartPosQueue *queue,ZopfliNode *nodes)

{
  ulong uVar1;
  float fVar2;
  int iVar3;
  BackwardMatch BVar4;
  ushort uVar5;
  ushort uVar6;
  ulong uVar7;
  ulong uVar8;
  anon_union_4_3_cc401a1e_for_u *paVar9;
  ulong uVar10;
  byte bVar11;
  ushort uVar12;
  size_t sVar13;
  ulong uVar14;
  long lVar15;
  uint8_t *puVar16;
  ulong uVar17;
  ulong uVar18;
  size_t sVar19;
  uint uVar20;
  long lVar21;
  uint8_t *puVar22;
  uint uVar23;
  ulong uVar24;
  ulong uVar25;
  ulong uVar26;
  ulong uVar27;
  ulong uVar28;
  ulong uVar29;
  uint uVar30;
  ulong uVar31;
  ulong uVar32;
  int iVar33;
  ulong uVar34;
  int iVar35;
  ulong uVar36;
  bool bVar37;
  float fVar38;
  float fVar39;
  float fVar40;
  ZopfliNode *in_stack_ffffffffffffff00;
  ulong local_f8;
  
  uVar1 = pos + block_start;
  sVar13 = max_backward_limit;
  if (uVar1 < max_backward_limit) {
    sVar13 = uVar1;
  }
  uVar7 = num_bytes - pos;
  iVar3 = params->quality;
  uVar14 = 0x96;
  if (10 < iVar3) {
    uVar14 = 0x145;
  }
  EvaluateNode(block_start,pos,max_backward_limit,(size_t)starting_dist_cache,(int *)model,
               (ZopfliCostModel *)queue,(StartPosQueue *)nodes,in_stack_ffffffffffffff00);
  uVar8 = 2;
  if (pos + 2 <= num_bytes) {
    uVar8 = (ulong)((-(int)queue->idx_ & 7U) << 5);
    fVar39 = (model->literal_costs_[pos] -
             model->literal_costs_[*(long *)((long)queue->q_[0].distance_cache + (uVar8 - 8))]) +
             *(float *)((long)queue->q_[0].distance_cache + uVar8 + 0x14) + model->min_cost_cmd_;
    paVar9 = &nodes[pos + 2].u;
    lVar21 = 4;
    uVar26 = 10;
    uVar10 = 2;
    do {
      uVar8 = uVar10;
      if (fVar39 < paVar9->cost) break;
      uVar8 = uVar10 + 1;
      bVar37 = uVar8 == uVar26;
      fVar38 = fVar39 + 1.0;
      if (!bVar37) {
        fVar38 = fVar39;
      }
      fVar39 = fVar38;
      lVar15 = 0;
      if (bVar37) {
        lVar15 = lVar21;
      }
      lVar21 = lVar21 << bVar37;
      uVar26 = uVar26 + lVar15;
      paVar9 = paVar9 + 4;
      lVar15 = pos + uVar10;
      uVar10 = uVar8;
    } while (lVar15 + 1U <= num_bytes);
  }
  puVar16 = ringbuffer + (uVar1 & ringbuffer_mask);
  uVar26 = (ulong)((uint)uVar7 & 7);
  local_f8 = 0;
  uVar10 = 0;
  do {
    uVar17 = queue->idx_;
    uVar25 = 8;
    if (uVar17 < 8) {
      uVar25 = uVar17;
    }
    if (uVar25 <= uVar10) {
      return local_f8;
    }
    uVar25 = (ulong)(((int)uVar10 - (int)uVar17 & 7U) << 5);
    uVar17 = pos - *(long *)((long)queue->q_[0].distance_cache + (uVar25 - 8));
    fVar39 = (float)uVar17;
    if (uVar17 < 6) {
      uVar31 = uVar17 & 0xffffffff;
    }
    else if (uVar17 < 0x82) {
      uVar30 = 0x1f;
      uVar20 = (uint)(uVar17 - 2);
      if (uVar20 != 0) {
        for (; uVar20 >> uVar30 == 0; uVar30 = uVar30 - 1) {
        }
      }
      uVar31 = (ulong)((int)(uVar17 - 2 >> ((char)(uVar30 ^ 0xffffffe0) + 0x1fU & 0x3f)) +
                       (uVar30 ^ 0xffffffe0) * 2 + 0x40);
    }
    else if (uVar17 < 0x842) {
      uVar30 = 0x1f;
      if ((int)fVar39 - 0x42U != 0) {
        for (; (int)fVar39 - 0x42U >> uVar30 == 0; uVar30 = uVar30 - 1) {
        }
      }
      uVar31 = (ulong)((uVar30 ^ 0xffe0) + 0x2a);
    }
    else {
      uVar31 = 0x15;
      if (0x1841 < uVar17) {
        uVar31 = (ulong)(ushort)(0x17 - (uVar17 < 0x5842));
      }
    }
    uVar17 = uVar31 & 0xffff;
    fVar38 = (model->literal_costs_[pos] - *model->literal_costs_) +
             (float)kInsExtra[uVar17] +
             *(float *)((long)queue->q_[0].distance_cache + uVar25 + 0x10);
    if (uVar8 - 1 < uVar7) {
      uVar5 = (ushort)uVar31 * 8 & 0x38;
      uVar27 = 0;
      uVar24 = uVar8 - 1;
      while (uVar28 = uVar24 + (uVar1 & ringbuffer_mask), uVar28 <= ringbuffer_mask) {
        uVar34 = (long)kDistanceCacheOffset[uVar27] +
                 (long)*(int *)((long)queue->q_[0].distance_cache +
                               (ulong)kDistanceCacheIndex[uVar27] * 4 + uVar25);
        if (uVar1 - uVar34 < uVar1 && uVar34 <= sVar13) {
          uVar18 = uVar1 - uVar34 & ringbuffer_mask;
          if ((uVar18 + uVar24 <= ringbuffer_mask) &&
             (ringbuffer[uVar28] == ringbuffer[uVar18 + uVar24])) {
            if (7 < uVar7) {
              lVar21 = 0;
              uVar28 = 0;
LAB_0010c738:
              if (*(ulong *)(puVar16 + uVar28 * 8) == *(ulong *)(ringbuffer + uVar28 * 8 + uVar18))
              goto code_r0x0010c74a;
              uVar18 = *(ulong *)(ringbuffer + uVar28 * 8 + uVar18) ^
                       *(ulong *)(puVar16 + uVar28 * 8);
              uVar28 = 0;
              if (uVar18 != 0) {
                for (; (uVar18 >> uVar28 & 1) == 0; uVar28 = uVar28 + 1) {
                }
              }
              uVar28 = (uVar28 >> 3 & 0x1fffffff) - lVar21;
              goto LAB_0010c77e;
            }
            puVar22 = puVar16;
            uVar36 = 0;
LAB_0010c931:
            uVar28 = uVar36;
            if (uVar26 != 0) {
              uVar29 = uVar26 | uVar36;
              uVar32 = uVar26;
              do {
                uVar28 = uVar36;
                if (ringbuffer[uVar36 + uVar18] != *puVar22) break;
                puVar22 = puVar22 + 1;
                uVar36 = uVar36 + 1;
                uVar32 = uVar32 - 1;
                uVar28 = uVar29;
              } while (uVar32 != 0);
            }
LAB_0010c77e:
            if (uVar24 + 1 <= uVar28) {
              fVar2 = model->cost_dist_[uVar27];
              paVar9 = &nodes[pos + uVar24 + 1].u;
              uVar18 = uVar24;
              do {
                uVar24 = uVar18 + 1;
                iVar35 = (int)uVar18;
                if (uVar24 < 10) {
                  uVar30 = iVar35 - 1;
LAB_0010c83a:
                  uVar6 = (ushort)uVar30;
                  uVar12 = uVar6 & 7 | uVar5;
                  if (0xf < uVar6 || (uVar27 != 0 || 7 < (ushort)uVar31)) goto LAB_0010c863;
                  uVar12 = uVar6 & 7 | uVar5;
                  if (7 < uVar6) {
                    uVar12 = uVar12 + 0x40;
                  }
                }
                else {
                  if (uVar24 < 0x86) {
                    uVar30 = 0x1f;
                    uVar20 = (uint)(uVar18 - 5);
                    if (uVar20 != 0) {
                      for (; uVar20 >> uVar30 == 0; uVar30 = uVar30 - 1) {
                      }
                    }
                    uVar30 = (int)(uVar18 - 5 >> ((char)(uVar30 ^ 0xffffffe0) + 0x1fU & 0x3f)) +
                             (uVar30 ^ 0xffffffe0) * 2 + 0x42;
                    goto LAB_0010c83a;
                  }
                  uVar30 = 0x17;
                  uVar12 = uVar5 | 7;
                  if (uVar24 < 0x846) {
                    uVar30 = 0x1f;
                    if (iVar35 - 0x45U != 0) {
                      for (; iVar35 - 0x45U >> uVar30 == 0; uVar30 = uVar30 - 1) {
                      }
                    }
                    uVar30 = (uVar30 ^ 0xffe0) + 0x2c;
                    goto LAB_0010c83a;
                  }
LAB_0010c863:
                  iVar33 = ((uVar30 & 0xffff) >> 3) + (int)(uVar17 >> 3) * 3;
                  uVar12 = uVar12 + ((ushort)(0x520d40 >> ((char)iVar33 * '\x02' & 0x1fU)) & 0xc0) +
                                    (short)iVar33 * 0x40 + 0x40;
                }
                fVar40 = fVar38;
                if (0x7f < uVar12) {
                  fVar40 = fVar2 + fVar38;
                }
                fVar40 = (float)kCopyExtra[uVar30 & 0xffff] + fVar40 + model->cost_cmd_[uVar12];
                if (fVar40 < paVar9->cost) {
                  ((ZopfliNode *)(paVar9 + -3))->length = iVar35 + 1U | 0x12000000;
                  paVar9[-2].next = (uint32_t)(float)uVar34;
                  paVar9[-1].next = (uint)fVar39 | (int)uVar27 * 0x8000000 + 0x8000000U;
                  paVar9->cost = fVar40;
                  if (local_f8 <= uVar24) {
                    local_f8 = uVar24;
                  }
                }
                uVar36 = uVar18 + 2;
                paVar9 = paVar9 + 4;
                uVar18 = uVar24;
              } while (uVar36 <= uVar28);
            }
          }
        }
        if ((0xe < uVar27) || (uVar27 = uVar27 + 1, uVar7 <= uVar24)) break;
      }
    }
    if (uVar10 < 2 && num_matches != 0) {
      sVar19 = 0;
      uVar25 = uVar8;
      do {
        BVar4 = matches[sVar19];
        uVar34 = (ulong)BVar4 & 0xffffffff;
        uVar24 = uVar34 + 0xf;
        uVar28 = (ulong)(params->dist).num_direct_distance_codes;
        uVar27 = uVar28 + 0x10;
        if (uVar27 <= uVar24) {
          uVar30 = (params->dist).distance_postfix_bits;
          bVar11 = (byte)uVar30;
          uVar24 = ~uVar28 + uVar34 + (4L << (bVar11 & 0x3f));
          uVar20 = 0x1f;
          uVar23 = (uint)uVar24;
          if (uVar23 != 0) {
            for (; uVar23 >> uVar20 == 0; uVar20 = uVar20 - 1) {
            }
          }
          uVar28 = (ulong)((uVar20 ^ 0xffffffe0) + 0x1f);
          lVar21 = uVar28 - uVar30;
          uVar24 = (~(-1 << (bVar11 & 0x1f)) & uVar23) + uVar27 +
                   (lVar21 * 2 + -2 + (ulong)((uVar24 >> (uVar28 & 0x3f) & 1) != 0) <<
                   (bVar11 & 0x3f)) | lVar21 * 0x400;
        }
        uVar28 = (ulong)BVar4 >> 0x25;
        uVar27 = uVar25;
        if (uVar14 < uVar28) {
          uVar27 = uVar28;
        }
        if (sVar13 < uVar34) {
          uVar27 = uVar28;
        }
        if (uVar28 <= uVar25) {
          uVar27 = uVar25;
        }
        uVar25 = uVar27;
        if (uVar27 <= uVar28) {
          fVar2 = model->cost_dist_[(uint)uVar24 & 0x3ff];
          uVar18 = (ulong)(BVar4.length_and_code & 0x1f);
          if (((ulong)BVar4 & 0x1f00000000) == 0) {
            uVar18 = uVar28;
          }
          uVar25 = uVar28 + 1;
          paVar9 = &nodes[pos + uVar27].u;
          lVar21 = uVar27 * 0x2000000 + 0x12000000;
          do {
            uVar28 = uVar27;
            if (sVar13 < uVar34) {
              uVar28 = uVar18;
            }
            iVar35 = (int)uVar28;
            if (uVar28 < 10) {
              uVar30 = iVar35 - 2;
            }
            else if (uVar28 < 0x86) {
              uVar30 = 0x1f;
              uVar20 = (uint)(uVar28 - 6);
              if (uVar20 != 0) {
                for (; uVar20 >> uVar30 == 0; uVar30 = uVar30 - 1) {
                }
              }
              uVar30 = (int)(uVar28 - 6 >> ((char)(uVar30 ^ 0xffffffe0) + 0x1fU & 0x3f)) +
                       (uVar30 ^ 0xffffffe0) * 2 + 0x42;
            }
            else {
              uVar30 = 0x17;
              if (uVar28 < 0x846) {
                uVar30 = 0x1f;
                if (iVar35 - 0x46U != 0) {
                  for (; iVar35 - 0x46U >> uVar30 == 0; uVar30 = uVar30 - 1) {
                  }
                }
                uVar30 = (uVar30 ^ 0xffe0) + 0x2c;
              }
            }
            iVar33 = ((uVar30 & 0xffff) >> 3) + (int)(uVar17 >> 3) * 3;
            fVar40 = (float)kCopyExtra[uVar30 & 0xffff] +
                     (float)((uint)(uVar24 >> 10) & 0x3f) + fVar38 + fVar2 +
                     model->cost_cmd_
                     [(uVar30 & 7 | ((uint)uVar31 & 7) << 3) +
                      (0x520d40U >> ((char)iVar33 * '\x02' & 0x1fU) & 0xc0) + iVar33 * 0x40 + 0x40 &
                      0xffff];
            if (fVar40 < paVar9->cost) {
              ((ZopfliNode *)(paVar9 + -3))->length =
                   (uint)uVar27 | (int)lVar21 + iVar35 * -0x2000000;
              paVar9[-2].next = BVar4.distance;
              paVar9[-1].next = (uint32_t)fVar39;
              paVar9->cost = fVar40;
              if (local_f8 <= uVar27) {
                local_f8 = uVar27;
              }
            }
            uVar27 = uVar27 + 1;
            paVar9 = paVar9 + 4;
            lVar21 = lVar21 + 0x2000000;
          } while (uVar25 != uVar27);
        }
        sVar19 = sVar19 + 1;
      } while (sVar19 != num_matches);
    }
    if (iVar3 < 0xb) {
      return local_f8;
    }
    bVar37 = 3 < uVar10;
    uVar10 = uVar10 + 1;
    if (bVar37) {
      return local_f8;
    }
  } while( true );
code_r0x0010c74a:
  uVar28 = uVar28 + 1;
  lVar21 = lVar21 + -8;
  puVar22 = puVar16 + (uVar7 & 0xfffffffffffffff8);
  uVar36 = uVar7 & 0xfffffffffffffff8;
  if (uVar7 >> 3 == uVar28) goto LAB_0010c931;
  goto LAB_0010c738;
}

Assistant:

static size_t UpdateNodes(
    const size_t num_bytes, const size_t block_start, const size_t pos,
    const uint8_t* ringbuffer, const size_t ringbuffer_mask,
    const BrotliEncoderParams* params, const size_t max_backward_limit,
    const int* starting_dist_cache, const size_t num_matches,
    const BackwardMatch* matches, const ZopfliCostModel* model,
    StartPosQueue* queue, ZopfliNode* nodes) {
  const size_t cur_ix = block_start + pos;
  const size_t cur_ix_masked = cur_ix & ringbuffer_mask;
  const size_t max_distance = BROTLI_MIN(size_t, cur_ix, max_backward_limit);
  const size_t max_len = num_bytes - pos;
  const size_t max_zopfli_len = MaxZopfliLen(params);
  const size_t max_iters = MaxZopfliCandidates(params);
  size_t min_len;
  size_t result = 0;
  size_t k;
  size_t gap = 0;

  EvaluateNode(block_start, pos, max_backward_limit, gap, starting_dist_cache,
      model, queue, nodes);

  {
    const PosData* posdata = StartPosQueueAt(queue, 0);
    float min_cost = (posdata->cost + ZopfliCostModelGetMinCostCmd(model) +
        ZopfliCostModelGetLiteralCosts(model, posdata->pos, pos));
    min_len = ComputeMinimumCopyLength(min_cost, nodes, num_bytes, pos);
  }

  /* Go over the command starting positions in order of increasing cost
     difference. */
  for (k = 0; k < max_iters && k < StartPosQueueSize(queue); ++k) {
    const PosData* posdata = StartPosQueueAt(queue, k);
    const size_t start = posdata->pos;
    const uint16_t inscode = GetInsertLengthCode(pos - start);
    const float start_costdiff = posdata->costdiff;
    const float base_cost = start_costdiff + (float)GetInsertExtra(inscode) +
        ZopfliCostModelGetLiteralCosts(model, 0, pos);

    /* Look for last distance matches using the distance cache from this
       starting position. */
    size_t best_len = min_len - 1;
    size_t j = 0;
    for (; j < BROTLI_NUM_DISTANCE_SHORT_CODES && best_len < max_len; ++j) {
      const size_t idx = kDistanceCacheIndex[j];
      const size_t backward =
          (size_t)(posdata->distance_cache[idx] + kDistanceCacheOffset[j]);
      size_t prev_ix = cur_ix - backward;
      size_t len = 0;
      uint8_t continuation = ringbuffer[cur_ix_masked + best_len];
      if (cur_ix_masked + best_len > ringbuffer_mask) {
        break;
      }
      if (BROTLI_PREDICT_FALSE(backward > max_distance + gap)) {
        continue;
      }
      if (backward <= max_distance) {
        if (prev_ix >= cur_ix) {
          continue;
        }

        prev_ix &= ringbuffer_mask;
        if (prev_ix + best_len > ringbuffer_mask ||
            continuation != ringbuffer[prev_ix + best_len]) {
          continue;
        }
        len = FindMatchLengthWithLimit(&ringbuffer[prev_ix],
                                       &ringbuffer[cur_ix_masked],
                                       max_len);
      } else {
        continue;
      }
      {
        const float dist_cost = base_cost +
            ZopfliCostModelGetDistanceCost(model, j);
        size_t l;
        for (l = best_len + 1; l <= len; ++l) {
          const uint16_t copycode = GetCopyLengthCode(l);
          const uint16_t cmdcode =
              CombineLengthCodes(inscode, copycode, j == 0);
          const float cost = (cmdcode < 128 ? base_cost : dist_cost) +
              (float)GetCopyExtra(copycode) +
              ZopfliCostModelGetCommandCost(model, cmdcode);
          if (cost < nodes[pos + l].u.cost) {
            UpdateZopfliNode(nodes, pos, start, l, l, backward, j + 1, cost);
            result = BROTLI_MAX(size_t, result, l);
          }
          best_len = l;
        }
      }
    }

    /* At higher iterations look only for new last distance matches, since
       looking only for new command start positions with the same distances
       does not help much. */
    if (k >= 2) continue;

    {
      /* Loop through all possible copy lengths at this position. */
      size_t len = min_len;
      for (j = 0; j < num_matches; ++j) {
        BackwardMatch match = matches[j];
        size_t dist = match.distance;
        BROTLI_BOOL is_dictionary_match =
            TO_BROTLI_BOOL(dist > max_distance + gap);
        /* We already tried all possible last distance matches, so we can use
           normal distance code here. */
        size_t dist_code = dist + BROTLI_NUM_DISTANCE_SHORT_CODES - 1;
        uint16_t dist_symbol;
        uint32_t distextra;
        uint32_t distnumextra;
        float dist_cost;
        size_t max_match_len;
        PrefixEncodeCopyDistance(
            dist_code, params->dist.num_direct_distance_codes,
            params->dist.distance_postfix_bits, &dist_symbol, &distextra);
        distnumextra = dist_symbol >> 10;
        dist_cost = base_cost + (float)distnumextra +
            ZopfliCostModelGetDistanceCost(model, dist_symbol & 0x3FF);

        /* Try all copy lengths up until the maximum copy length corresponding
           to this distance. If the distance refers to the static dictionary, or
           the maximum length is long enough, try only one maximum length. */
        max_match_len = BackwardMatchLength(&match);
        if (len < max_match_len &&
            (is_dictionary_match || max_match_len > max_zopfli_len)) {
          len = max_match_len;
        }
        for (; len <= max_match_len; ++len) {
          const size_t len_code =
              is_dictionary_match ? BackwardMatchLengthCode(&match) : len;
          const uint16_t copycode = GetCopyLengthCode(len_code);
          const uint16_t cmdcode = CombineLengthCodes(inscode, copycode, 0);
          const float cost = dist_cost + (float)GetCopyExtra(copycode) +
              ZopfliCostModelGetCommandCost(model, cmdcode);
          if (cost < nodes[pos + len].u.cost) {
            UpdateZopfliNode(nodes, pos, start, len, len_code, dist, 0, cost);
            result = BROTLI_MAX(size_t, result, len);
          }
        }
      }
    }
  }
  return result;
}